

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_montgomery_double(void)

{
  MontgomeryCurve *mc;
  size_t sVar1;
  MontgomeryPoint *src;
  MontgomeryPoint *pMVar2;
  size_t i;
  ulong index;
  
  mc = mcurve();
  pMVar2 = (MontgomeryPoint *)0x0;
  for (index = 0; sVar1 = (*looplimit)(7), index < sVar1; index = index + 1) {
    src = mpoint(mc,index);
    if (pMVar2 != (MontgomeryPoint *)0x0) {
      ecc_montgomery_point_copy_into(pMVar2,src);
      ecc_montgomery_point_free(src);
      src = pMVar2;
    }
    log_start();
    pMVar2 = ecc_montgomery_double(src);
    log_end();
    ecc_montgomery_point_free(pMVar2);
    pMVar2 = src;
  }
  ecc_montgomery_point_free(pMVar2);
  ecc_montgomery_curve_free(mc);
  return;
}

Assistant:

static void test_ecc_montgomery_double(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }

        log_start();
        MontgomeryPoint *r = ecc_montgomery_double(a);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
}